

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

_Bool fy_tag_is_default(char *handle,size_t handle_size,char *prefix,size_t prefix_size)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  fy_tag *pfVar5;
  _Bool _Var6;
  
  if (handle_size == 0xffffffffffffffff) {
    handle_size = strlen(handle);
  }
  if (prefix_size == 0xffffffffffffffff) {
    prefix_size = strlen(prefix);
  }
  pfVar5 = (fy_tag *)&_compoundliteral;
  _Var6 = true;
  lVar4 = 1;
  do {
    pcVar1 = pfVar5->handle;
    sVar3 = strlen(pcVar1);
    if ((handle_size == sVar3) && (iVar2 = bcmp(handle,pcVar1,handle_size), iVar2 == 0)) {
      pcVar1 = pfVar5->prefix;
      sVar3 = strlen(pcVar1);
      if ((prefix_size == sVar3) && (iVar2 = bcmp(prefix,pcVar1,prefix_size), iVar2 == 0)) {
        return _Var6;
      }
    }
    pfVar5 = fy_default_tags[lVar4];
    lVar4 = lVar4 + 1;
    _Var6 = lVar4 != 4;
    if (!_Var6) {
      return _Var6;
    }
  } while( true );
}

Assistant:

bool fy_tag_is_default(const char *handle, size_t handle_size,
                       const char *prefix, size_t prefix_size) {
    int i;
    const struct fy_tag *fytag;

    if (handle_size == (size_t) -1)
        handle_size = strlen(handle);

    if (prefix_size == (size_t) -1)
        prefix_size = strlen(prefix);

    for (i = 0; (fytag = fy_default_tags[i]) != NULL; i++) {

        if (handle_size == strlen(fytag->handle) &&
            !memcmp(handle, fytag->handle, handle_size) &&
            prefix_size == strlen(fytag->prefix) &&
            !memcmp(prefix, fytag->prefix, prefix_size))
            return true;

    }
    return false;
}